

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

void free_obj_index(OBJ_INDEX_DATA *pObj)

{
  AFFECT_DATA *af;
  EXTRA_DESCR_DATA *ed;
  
  free_pstring(pObj->name);
  free_pstring(pObj->short_descr);
  free_pstring(pObj->description);
  for (af = pObj->affected; af != (AFFECT_DATA *)0x0; af = af->next) {
    free_affect(af);
  }
  for (ed = pObj->extra_descr; ed != (EXTRA_DESCR_DATA *)0x0; ed = ed->next) {
    free_extra_descr(ed);
  }
  pObj->next = obj_index_free;
  obj_index_free = pObj;
  return;
}

Assistant:

void free_obj_index(OBJ_INDEX_DATA *pObj)
{
	EXTRA_DESCR_DATA *pExtra;
	AFFECT_DATA *pAf;

	free_pstring(pObj->name);
	free_pstring(pObj->short_descr);
	free_pstring(pObj->description);

	for (pAf = pObj->affected; pAf; pAf = pAf->next)
	{
		free_affect(pAf);
	}

	for (pExtra = pObj->extra_descr; pExtra; pExtra = pExtra->next)
	{
		free_extra_descr(pExtra);
	}

	pObj->next = obj_index_free;
	obj_index_free = pObj;
}